

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

ReadFileResult cmCMakePresetsGraphInternal::PresetIntHelper(int *out,Value *value)

{
  int iVar1;
  ReadFileResult RVar2;
  Value *value_local;
  int *out_local;
  
  if (PresetIntHelper(int&,Json::Value_const*)::helper == '\0') {
    iVar1 = __cxa_guard_acquire(&PresetIntHelper(int&,Json::Value_const*)::helper);
    if (iVar1 != 0) {
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Int
                (&PresetIntHelper::helper,READ_OK,INVALID_PRESET,0);
      __cxa_atexit(std::function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)>::
                   ~function,&PresetIntHelper::helper,&__dso_handle);
      __cxa_guard_release(&PresetIntHelper(int&,Json::Value_const*)::helper);
    }
  }
  RVar2 = std::function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)>::
          operator()(&PresetIntHelper::helper,out,value);
  return RVar2;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetIntHelper(int& out,
                                                    const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Int(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET);

  return helper(out, value);
}